

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::~VersionSet(VersionSet *this)

{
  Writer *this_00;
  long lVar1;
  
  Version::Unref(this->current_);
  if ((this->dummy_versions_).next_ == &this->dummy_versions_) {
    this_00 = this->descriptor_log_;
    if (this_00 != (Writer *)0x0) {
      log::Writer::~Writer(this_00);
    }
    operator_delete(this_00);
    if (this->descriptor_file_ != (WritableFile *)0x0) {
      (*this->descriptor_file_->_vptr_WritableFile[1])();
    }
    lVar1 = 0;
    do {
      std::__cxx11::string::_M_dispose();
      lVar1 = lVar1 + -0x20;
    } while (lVar1 != -0xe0);
    Version::~Version(&this->dummy_versions_);
    Comparator::~Comparator(&(this->icmp_).super_Comparator);
    std::__cxx11::string::_M_dispose();
    return;
  }
  __assert_fail("dummy_versions_.next_ == &dummy_versions_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                ,0x2f3,"leveldb::VersionSet::~VersionSet()");
}

Assistant:

VersionSet::~VersionSet() {
  current_->Unref();
  assert(dummy_versions_.next_ == &dummy_versions_);  // List must be empty
  delete descriptor_log_;
  delete descriptor_file_;
}